

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void print_varr_insns(gen_ctx_t gen_ctx,char *title,VARR_bb_insn_t *bb_insns)

{
  char cVar1;
  MIR_insn_t_conflict insn;
  void *pvVar2;
  undefined8 uVar3;
  void *__ptr;
  MIR_insn_t *ppMVar4;
  bb_t_conflict pbVar5;
  bb_insn_t pbVar6;
  gen_ctx_t gen_ctx_00;
  bb_insn_t_conflict unaff_R12;
  size_t nop;
  ulong unaff_R13;
  ulong uVar7;
  char *unaff_R15;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  int iStack_74;
  bb_t_conflict pbStack_70;
  bb_insn_t pbStack_68;
  gen_ctx_t pgStack_60;
  VARR_bb_insn_t *pVStack_58;
  bb_insn_t_conflict pbStack_50;
  ulong uStack_48;
  gen_ctx_t pgStack_40;
  char *pcStack_38;
  
  gen_ctx_00 = (gen_ctx_t)gen_ctx->debug_file;
  fprintf((FILE *)gen_ctx_00,"%s insns:\n",title);
  if (bb_insns == (VARR_bb_insn_t *)0x0) {
LAB_00156425:
    print_varr_insns_cold_2();
    pVStack_58 = bb_insns;
    pbStack_50 = unaff_R12;
    uStack_48 = unaff_R13;
    pgStack_40 = gen_ctx;
    pcStack_38 = unaff_R15;
    free_fake_bb_insns(gen_ctx_00->ssa_ctx->arg_bb_insns);
    free_fake_bb_insns(gen_ctx_00->ssa_ctx->undef_insns);
    pbVar5 = (gen_ctx_00->curr_cfg->bbs).head;
    if (pbVar5 != (bb_t_conflict)0x0) {
      pgStack_60 = gen_ctx_00;
      do {
        pbStack_70 = pbVar5;
        for (pbVar6 = (pbVar5->bb_insns).head; pbVar6 != (bb_insn_t)0x0;
            pbVar6 = (pbVar6->bb_insn_link).next) {
          insn = pbVar6->insn;
          uVar7 = *(ulong *)&insn->field_0x18 >> 0x20;
          if (uVar7 != 0) {
            nop = 0;
            pbStack_68 = pbVar6;
LAB_001564a7:
            do {
              MIR_insn_op_mode(gen_ctx_00->ctx,insn,nop,&iStack_74);
              if (iStack_74 != 0) {
                cVar1 = insn->ops[nop].field_0x8;
                if (cVar1 == '\x02') {
                  __ptr = insn->ops[(int)nop].data;
                  gen_ctx_00 = pgStack_60;
                  while (pgStack_60 = gen_ctx_00, __ptr != (void *)0x0) {
                    pvVar2 = *(void **)((long)__ptr + 0x20);
                    free(__ptr);
                    __ptr = pvVar2;
                    gen_ctx_00 = pgStack_60;
                  }
                  nop = nop + 1;
                  if (uVar7 <= nop) break;
                  goto LAB_001564a7;
                }
                if (cVar1 != '\v') {
                  __assert_fail("op_ref->mode == MIR_OP_VAR",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x4ff,
                                "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                               );
                }
              }
              nop = nop + 1;
            } while (nop < uVar7);
            auVar8 = vpbroadcastq_avx512f(ZEXT816(0x30));
            auVar9 = vpbroadcastq_avx512f(ZEXT816(8));
            uVar7 = *(ulong *)&insn->field_0x18 >> 0x20;
            pbVar6 = pbStack_68;
            if (uVar7 != 0) {
              auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              uVar7 = uVar7 + 7 & 0xfffffffffffffff8;
              auVar11 = vpbroadcastq_avx512f();
              do {
                auVar12 = vpmullq_avx512dq(auVar10,auVar8);
                uVar3 = vpcmpuq_avx512f(auVar10,auVar11,2);
                auVar10 = vpaddq_avx512f(auVar10,auVar9);
                uVar7 = uVar7 - 8;
                vpscatterqq_avx512f(ZEXT864(insn->ops) + ZEXT864(0) + auVar12,uVar3,
                                    ZEXT1664((undefined1  [16])0x0));
              } while (uVar7 != 0);
            }
          }
        }
        pbVar5 = (pbStack_70->bb_link).next;
      } while (pbVar5 != (bb_t)0x0);
      for (pbVar5 = (gen_ctx_00->curr_cfg->bbs).head; pbVar5 != (bb_t_conflict)0x0;
          pbVar5 = (pbVar5->bb_link).next) {
        pbVar6 = (pbVar5->bb_insns).head;
        while (pbVar6 != (bb_insn_t)0x0) {
          ppMVar4 = &pbVar6->insn;
          pbVar6 = (pbVar6->bb_insn_link).next;
          if (*(int *)&(*ppMVar4)->field_0x18 == 0xba) {
            gen_delete_insn(gen_ctx_00,*ppMVar4);
          }
        }
      }
    }
    return;
  }
  if (bb_insns->els_num != 0) {
    unaff_R15 = "  %-5lu";
    unaff_R13 = 0;
    do {
      if (bb_insns->varr == (bb_insn_t_conflict *)0x0) {
        print_varr_insns_cold_1();
        goto LAB_00156425;
      }
      unaff_R12 = bb_insns->varr[unaff_R13];
      if (unaff_R12 != (bb_insn_t_conflict)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"  %-5lu",(ulong)unaff_R12->index);
        gen_ctx_00 = gen_ctx;
        print_bb_insn(gen_ctx,unaff_R12,1);
      }
      unaff_R13 = unaff_R13 + 1;
    } while (unaff_R13 < bb_insns->els_num);
  }
  return;
}

Assistant:

static void print_varr_insns (gen_ctx_t gen_ctx, const char *title, VARR (bb_insn_t) * bb_insns) {
  fprintf (debug_file, "%s insns:\n", title);
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, bb_insns); i++) {
    bb_insn_t bb_insn = VARR_GET (bb_insn_t, bb_insns, i);
    if (bb_insn == NULL) continue;
    fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
    print_bb_insn (gen_ctx, bb_insn, TRUE);
  }
}